

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoStore<unsigned_long,unsigned_char>(Thread *this,Instr instr,Ptr *out_trap)

{
  Store *pSVar1;
  bool bVar2;
  u32 uVar3;
  RefVec *this_00;
  const_reference pvVar4;
  unsigned_long uVar5;
  Memory *pMVar6;
  ulong uVar7;
  string local_88;
  Ptr local_68;
  Enum local_4c;
  u32 local_48;
  uchar local_41;
  u32 offset;
  uchar val;
  undefined1 local_38 [8];
  Ptr memory;
  Ptr *out_trap_local;
  Thread *this_local;
  
  pSVar1 = this->store_;
  memory.root_index_ = (Index)out_trap;
  this_00 = Instance::memories(this->inst_);
  pvVar4 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                     (this_00,(ulong)instr.field_2.imm_u32);
  _offset = pvVar4->index;
  RefPtr<wabt::interp::Memory>::RefPtr((RefPtr<wabt::interp::Memory> *)local_38,pSVar1,_offset);
  uVar5 = Pop<unsigned_long>(this);
  local_41 = (uchar)uVar5;
  local_48 = Pop<unsigned_int>(this);
  pMVar6 = RefPtr<wabt::interp::Memory>::operator->((RefPtr<wabt::interp::Memory> *)local_38);
  local_4c = (Enum)Memory::Store<unsigned_char>
                             (pMVar6,local_48,instr.field_2.imm_u32x2.snd,local_41);
  bVar2 = Failed((Result)local_4c);
  if (bVar2) {
    pSVar1 = this->store_;
    uVar7 = (ulong)local_48;
    pMVar6 = RefPtr<wabt::interp::Memory>::operator->((RefPtr<wabt::interp::Memory> *)local_38);
    uVar3 = Memory::ByteSize(pMVar6);
    StringPrintf_abi_cxx11_
              (&local_88,"out of bounds memory access: access at %lu+%zd >= max value %u",
               uVar7 + instr.field_2.imm_u32x2.snd,1,(ulong)uVar3);
    Trap::New(&local_68,pSVar1,&local_88,&this->frames_);
    RefPtr<wabt::interp::Trap>::operator=
              ((RefPtr<wabt::interp::Trap> *)memory.root_index_,&local_68);
    this_local._4_4_ = Trap;
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_68);
    std::__cxx11::string::~string((string *)&local_88);
  }
  else {
    this_local._4_4_ = Ok;
  }
  RefPtr<wabt::interp::Memory>::~RefPtr((RefPtr<wabt::interp::Memory> *)local_38);
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoStore(Instr instr, Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  V val = static_cast<V>(Pop<T>());
  u32 offset = Pop<u32>();
  TRAP_IF(Failed(memory->Store(offset, instr.imm_u32x2.snd, val)),
          StringPrintf("out of bounds memory access: access at %" PRIu64
                       "+%" PRIzd " >= max value %u",
                       u64{offset} + instr.imm_u32x2.snd, sizeof(V),
                       memory->ByteSize()));
  return RunResult::Ok;
}